

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

xmlIDPtr xmlAddID(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlChar *value,xmlAttrPtr attr)

{
  int iVar1;
  xmlIDPtr id;
  xmlIDPtr local_20;
  
  if (attr == (xmlAttrPtr)0x0) {
    return (xmlIDPtr)0x0;
  }
  if (attr->doc == doc) {
    iVar1 = xmlAddIDInternal(attr,value,&local_20);
    if (iVar1 < 0) {
      xmlVErrMemory(ctxt);
    }
    else if (ctxt != (xmlValidCtxtPtr)0x0 && iVar1 == 0) {
      xmlDoErrValid(ctxt,attr->parent,XML_DTD_ID_REDEFINED,2,value,(xmlChar *)0x0,(xmlChar *)0x0,0,
                    "ID %s already defined\n",value,0,0);
    }
  }
  else {
    local_20 = (xmlIDPtr)0x0;
  }
  return local_20;
}

Assistant:

xmlIDPtr
xmlAddID(xmlValidCtxtPtr ctxt, xmlDocPtr doc, const xmlChar *value,
         xmlAttrPtr attr) {
    xmlIDPtr id;
    int res;

    if ((attr == NULL) || (doc != attr->doc))
        return(NULL);

    res = xmlAddIDInternal(attr, value, &id);
    if (res < 0) {
        xmlVErrMemory(ctxt);
    }
#ifdef LIBXML_VALID_ENABLED
    else if (res == 0) {
        if (ctxt != NULL) {
            /*
             * The id is already defined in this DTD.
             */
            xmlErrValidNode(ctxt, attr->parent, XML_DTD_ID_REDEFINED,
                            "ID %s already defined\n", value, NULL, NULL);
        }
    }
#endif /* LIBXML_VALID_ENABLED */

    return(id);
}